

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_contextual_item_symbol_text
              (nk_context *ctx,nk_symbol_type symbol,char *text,int len,nk_flags align)

{
  nk_window *pnVar1;
  nk_widget_layout_states nVar2;
  int iVar3;
  nk_context *in;
  nk_rect bounds;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x58a3,
                  "int nk_contextual_item_symbol_text(struct nk_context *, enum nk_symbol_type, const char *, int, nk_flags)"
                 );
  }
  pnVar1 = ctx->current;
  if (pnVar1 != (nk_window *)0x0) {
    if (pnVar1->layout != (nk_panel *)0x0) {
      nVar2 = nk_widget_fitting(&bounds,ctx,(ctx->style).contextual_button.padding);
      if (nVar2 != NK_WIDGET_INVALID) {
        if (nVar2 == NK_WIDGET_ROM) {
          in = (nk_context *)0x0;
        }
        else {
          in = (nk_context *)0x0;
          if ((pnVar1->layout->flags & 0x1000) == 0) {
            in = ctx;
          }
        }
        iVar3 = nk_do_button_text_symbol
                          (&ctx->last_widget_state,&pnVar1->buffer,bounds,symbol,text,len,align,
                           NK_BUTTON_DEFAULT,&(ctx->style).contextual_button,(ctx->style).font,
                           &in->input);
        if (iVar3 == 0) {
          nVar2 = NK_WIDGET_INVALID;
        }
        else {
          nk_contextual_close(ctx);
          nVar2 = NK_WIDGET_VALID;
        }
      }
      return nVar2;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x58a5,
                  "int nk_contextual_item_symbol_text(struct nk_context *, enum nk_symbol_type, const char *, int, nk_flags)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x58a4,
                "int nk_contextual_item_symbol_text(struct nk_context *, enum nk_symbol_type, const char *, int, nk_flags)"
               );
}

Assistant:

NK_API int
nk_contextual_item_symbol_text(struct nk_context *ctx, enum nk_symbol_type symbol,
    const char *text, int len, nk_flags align)
{
    struct nk_window *win;
    const struct nk_input *in;
    const struct nk_style *style;

    struct nk_rect bounds;
    enum nk_widget_layout_states state;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    state = nk_widget_fitting(&bounds, ctx, style->contextual_button.padding);
    if (!state) return nk_false;

    in = (state == NK_WIDGET_ROM || win->layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    if (nk_do_button_text_symbol(&ctx->last_widget_state, &win->buffer, bounds,
        symbol, text, len, align, NK_BUTTON_DEFAULT, &style->contextual_button, style->font, in)) {
        nk_contextual_close(ctx);
        return nk_true;
    }
    return nk_false;
}